

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O2

VarId refill(map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
             *redundantphi,VarId *name)

{
  _Rb_tree_color _Var1;
  iterator iVar2;
  _Base_ptr *pp_Var3;
  key_type *in_RDX;
  undefined8 extraout_RDX;
  VarId VVar4;
  
  iVar2 = std::
          _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
          ::find((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                  *)name,in_RDX);
  pp_Var3 = &iVar2._M_node[1]._M_right;
  if (iVar2._M_node == (_Base_ptr)&name->id) {
    pp_Var3 = (_Base_ptr *)&in_RDX->id;
  }
  _Var1 = *(_Rb_tree_color *)pp_Var3;
  *(undefined ***)&(redundantphi->_M_t)._M_impl = &PTR_display_001d90d0;
  (redundantphi->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _Var1;
  VVar4._8_8_ = extraout_RDX;
  VVar4.super_Displayable._vptr_Displayable = (_func_int **)redundantphi;
  return VVar4;
}

Assistant:

mir::inst::VarId refill(map<mir::inst::VarId, mir::inst::VarId> redundantphi,
                        mir::inst::VarId name) {
  map<mir::inst::VarId, mir::inst::VarId>::iterator it =
      redundantphi.find(name);
  if (it == redundantphi.end()) {
    return name;
  } else {
    return it->second;
  }
}